

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O3

void __thiscall
osqp::anon_unknown_0::OsqpTest_ErrorIfNotPsd_Test::~OsqpTest_ErrorIfNotPsd_Test
          (OsqpTest_ErrorIfNotPsd_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(OsqpTest, ErrorIfNotPsd) {
  // Minimize -x^2.

  SparseMatrix<double> objective_matrix(1, 1);
  const Triplet<double> kTripletsP[] = {{0, 0, -2.0}};
  objective_matrix.setFromTriplets(std::begin(kTripletsP),
                                   std::end(kTripletsP));

  SparseMatrix<double> constraint_matrix(0, 1);

  OsqpInstance instance;
  instance.objective_matrix = objective_matrix;
  instance.objective_vector.resize(1);
  instance.objective_vector << 0.0;
  instance.constraint_matrix = constraint_matrix;
  // instance.lower_bounds not set.
  // instance.upper_bounds not set.

  OsqpSolver solver;
  OsqpSettings settings;
  settings.eps_abs = kTolerance;
  settings.eps_rel = 0.0;
  settings.verbose = true;
  EXPECT_EQ(solver.Init(instance, settings).code(),
            absl::StatusCode::kInvalidArgument);
}